

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O2

bool QCoreApplicationPrivate::isTranslatorInstalled(QTranslator *translator)

{
  QObjectData *pQVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QReadLocker local_28;
  QTranslator *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (QCoreApplication::self == (QCoreApplication *)0x0) {
    bVar2 = false;
  }
  else {
    pQVar1 = (QCoreApplication::self->super_QObject).d_ptr.d;
    local_28.q_val = (quintptr)&pQVar1[2].parent;
    QReadLocker::relock(&local_28);
    bVar2 = QListSpecialMethodsBase<QTranslator*>::contains<QTranslator*>
                      ((QListSpecialMethodsBase<QTranslator*> *)
                       &pQVar1[1].bindingStorage.bindingStatus,&local_20);
    QReadLocker::~QReadLocker(&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QCoreApplicationPrivate::isTranslatorInstalled(QTranslator *translator)
{
    if (!QCoreApplication::self)
        return false;
    QCoreApplicationPrivate *d = QCoreApplication::self->d_func();
    QReadLocker locker(&d->translateMutex);
    return d->translators.contains(translator);
}